

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

void extendFortressPiece(PieceEnv *env,Piece *p)

{
  uint64_t *in_RSI;
  undefined8 in_RDI;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  Piece *in_stack_00000018;
  PieceEnv *in_stack_00000020;
  int h;
  undefined8 in_stack_ffffffffffffffd0;
  uint64_t *in_stack_ffffffffffffffd8;
  
  if (*(char *)((long)in_RSI + 0x2e) == '\x01') {
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
  }
  else if ((*(char *)((long)in_RSI + 0x2e) == '\x02') || (*(char *)((long)in_RSI + 0x2e) == '\0')) {
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
  }
  else if (*(char *)((long)in_RSI + 0x2e) == '\x03') {
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
  }
  else if (*(char *)((long)in_RSI + 0x2e) == '\x04') {
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
  }
  else if (*(char *)((long)in_RSI + 0x2e) == '\x06') {
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
  }
  else if (*(char *)((long)in_RSI + 0x2e) == '\a') {
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
  }
  else if (*(char *)((long)in_RSI + 0x2e) == '\b') {
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
  }
  else if (*(char *)((long)in_RSI + 0x2e) == '\t') {
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
  }
  else if (*(char *)((long)in_RSI + 0x2e) == '\n') {
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
  }
  else if (*(char *)((long)in_RSI + 0x2e) == '\v') {
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
  }
  else if (*(char *)((long)in_RSI + 0x2e) == '\f') {
    nextInt(in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
    nextInt(in_RSI,(int)((ulong)in_RDI >> 0x20));
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
  }
  else if (*(char *)((long)in_RSI + 0x2e) == '\r') {
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
    extendFortress(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,in_stack_00000008);
  }
  return;
}

Assistant:

static
void extendFortressPiece(PieceEnv *env, Piece *p)
{
    if (p->type == BRIDGE_STRAIGHT) {
        extendFortress(env, p, 1, 3,  0, 0);
    } else if (p->type == BRIDGE_CROSSING || p->type == FORTRESS_START) {
        extendFortress(env, p, 8, 3,  0, 0);
        extendFortress(env, p, 8, 3, -1, 0);
        extendFortress(env, p, 8, 3,  1, 0);
    } else if (p->type == BRIDGE_FORTIFIED_CROSSING) {
        extendFortress(env, p, 2, 0,  0, 0);
        extendFortress(env, p, 2, 0, -1, 0);
        extendFortress(env, p, 2, 0,  1, 0);
    } else if (p->type == BRIDGE_STAIRS) {
        extendFortress(env, p, 2, 6,  1, 0);
    } else if (p->type == BRIDGE_CORRIDOR_ENTRANCE) {
        extendFortress(env, p, 5, 3,  0, 1);
    } else if (p->type == CORRIDOR_STRAIGHT) {
        extendFortress(env, p, 1, 0,  0, 1);
    } else if (p->type == CORRIDOR_CROSSING) {
        extendFortress(env, p, 1, 0,  0, 1);
        extendFortress(env, p, 1, 0, -1, 1);
        extendFortress(env, p, 1, 0,  1, 1);
    } else if (p->type == CORRIDOR_TURN_RIGHT) {
        extendFortress(env, p, 1, 0,  1, 1);
    } else if (p->type == CORRIDOR_TURN_LEFT) {
        extendFortress(env, p, 1, 0, -1, 1);
    } else if (p->type == CORRIDOR_STAIRS) {
        extendFortress(env, p, 1, 0,  0, 1);
    } else if (p->type == CORRIDOR_T_CROSSING) {
        int h = (p->rot == 0 || p->rot == 3) ? 5 : 1;
        extendFortress(env, p, h, 0, -1, nextInt(env->rng, 8) != 0);
        extendFortress(env, p, h, 0,  1, nextInt(env->rng, 8) != 0);
    } else if (p->type == CORRIDOR_NETHER_WART) {
        extendFortress(env, p, 5, 3,  0, 1);
        extendFortress(env, p, 5, 11, 0, 1);
    }
}